

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_read_mco(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  J2K_MCT_ELEMENT_TYPE JVar1;
  opj_image_t *poVar2;
  opj_simple_mcc_decorrelation_data_t *poVar3;
  opj_mct_data_t *poVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  opj_tcp_v2_t *poVar8;
  OPJ_FLOAT32 *pOVar9;
  void *__ptr;
  OPJ_UINT32 OVar10;
  ulong uVar11;
  long lVar12;
  OPJ_INT32 *pOVar13;
  char *fmt;
  ulong uVar14;
  opj_bool oVar15;
  opj_j2k_v2_t *poVar16;
  OPJ_UINT32 OVar17;
  uint uVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 l_tmp;
  uint local_5c;
  opj_tcp_v2_t *local_58;
  opj_j2k_v2_t *local_50;
  OPJ_UINT32 local_44;
  opj_image_t *local_40;
  OPJ_BYTE *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar8 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar8 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size == 0) {
    fmt = "Error reading MCO marker\n";
    oVar15 = 0;
    iVar20 = 1;
  }
  else {
    poVar2 = p_j2k->m_private_image;
    oVar15 = 1;
    local_58 = poVar8;
    local_50 = p_j2k;
    opj_read_bytes_LE(p_header_data,&local_5c,1);
    poVar16 = local_50;
    poVar8 = local_58;
    auVar7 = _DAT_00219ba0;
    auVar6 = _DAT_00219b90;
    auVar5 = _DAT_00219b80;
    if (local_5c < 2) {
      if (local_5c + 1 == p_header_size) {
        uVar11 = (ulong)poVar2->numcomps;
        if (uVar11 != 0) {
          lVar12 = uVar11 - 1;
          auVar19._8_4_ = (int)lVar12;
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
          pOVar13 = &local_58->tccps->m_dc_level_shift;
          uVar14 = 0;
          auVar19 = auVar19 ^ _DAT_00219ba0;
          do {
            auVar21._8_4_ = (int)uVar14;
            auVar21._0_8_ = uVar14;
            auVar21._12_4_ = (int)(uVar14 >> 0x20);
            auVar22 = (auVar21 | auVar6) ^ auVar7;
            iVar20 = auVar19._4_4_;
            if ((bool)(~(auVar22._4_4_ == iVar20 && auVar19._0_4_ < auVar22._0_4_ ||
                        iVar20 < auVar22._4_4_) & 1)) {
              *pOVar13 = 0;
            }
            if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
                auVar22._12_4_ <= auVar19._12_4_) {
              pOVar13[0x10e] = 0;
            }
            auVar21 = (auVar21 | auVar5) ^ auVar7;
            iVar23 = auVar21._4_4_;
            if (iVar23 <= iVar20 && (iVar23 != iVar20 || auVar21._0_4_ <= auVar19._0_4_)) {
              pOVar13[0x21c] = 0;
              pOVar13[0x32a] = 0;
            }
            uVar14 = uVar14 + 4;
            pOVar13 = pOVar13 + 0x438;
          } while ((uVar11 + 3 & 0xfffffffffffffffc) != uVar14);
        }
        if (local_58->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
          free(local_58->m_mct_decoding_matrix);
          poVar8->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
        }
        if (local_5c != 0) {
          uVar18 = 0;
          do {
            p_header_data = p_header_data + 1;
            opj_read_bytes_LE(p_header_data,&local_44,1);
            poVar3 = poVar8->m_mcc_records;
            OVar17 = poVar8->m_nb_mcc_records;
            OVar10 = 0;
            if ((OVar17 != 0) && (OVar10 = OVar17, poVar3->m_index == local_44)) {
              OVar10 = 0;
            }
            if (OVar10 != OVar17) {
              poVar2 = poVar16->m_private_image;
              OVar17 = poVar2->numcomps;
              if (poVar3->m_nb_comps == OVar17) {
                poVar4 = poVar3->m_decorrelation_array;
                local_40 = poVar2;
                local_38 = p_header_data;
                if (poVar4 != (opj_mct_data_t *)0x0) {
                  JVar1 = poVar4->m_element_type;
                  OVar17 = OVar17 * OVar17;
                  if (poVar4->m_data_size != MCT_ELEMENT_SIZE[JVar1] * OVar17) {
                    return 0;
                  }
                  pOVar9 = (OPJ_FLOAT32 *)malloc((ulong)(OVar17 * 4));
                  local_58->m_mct_decoding_matrix = pOVar9;
                  if (pOVar9 == (OPJ_FLOAT32 *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_float[JVar1])(poVar4->m_data,pOVar9,OVar17);
                  poVar16 = local_50;
                }
                poVar4 = poVar3->m_offset_array;
                p_header_data = local_38;
                if (poVar4 != (opj_mct_data_t *)0x0) {
                  JVar1 = poVar4->m_element_type;
                  OVar17 = local_40->numcomps;
                  if (poVar4->m_data_size != MCT_ELEMENT_SIZE[JVar1] * OVar17) {
                    return 0;
                  }
                  __ptr = malloc((ulong)(OVar17 * 4));
                  if (__ptr == (void *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_int32[JVar1])(poVar4->m_data,__ptr,OVar17);
                  OVar17 = local_40->numcomps;
                  if (OVar17 != 0) {
                    pOVar13 = &local_58->tccps->m_dc_level_shift;
                    lVar12 = 0;
                    do {
                      *pOVar13 = *(OPJ_INT32 *)((long)__ptr + lVar12 * 4);
                      pOVar13 = pOVar13 + 0x10e;
                      lVar12 = lVar12 + 1;
                    } while (OVar17 != (OPJ_UINT32)lVar12);
                  }
                  free(__ptr);
                  poVar16 = local_50;
                  p_header_data = local_38;
                }
              }
            }
            uVar18 = uVar18 + 1;
            poVar8 = local_58;
          } while (uVar18 < local_5c);
        }
        return 1;
      }
      fmt = "Error reading MCO marker\n";
      oVar15 = 0;
    }
    else {
      fmt = "Cannot take in charge multiple transformation stages.\n";
    }
    iVar20 = 2;
  }
  opj_event_msg_v2(p_manager,iVar20,fmt);
  return oVar15;
}

Assistant:

opj_bool j2k_read_mco (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 l_tmp, i;
	OPJ_UINT32 l_nb_stages;
	opj_tcp_v2_t * l_tcp;
	opj_tccp_t * l_tccp;
	opj_image_t * l_image;
	opj_image_comp_t * l_img_comp;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_stages,1);				/* Nmco : only one tranform stage*/
	++p_header_data;

	if (l_nb_stages > 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple transformation stages.\n");
		return OPJ_TRUE;
	}

	if (p_header_size != l_nb_stages + 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	l_tccp = l_tcp->tccps;
	l_img_comp = l_image->comps;

	for (i=0;i<l_image->numcomps;++i) {
		l_tccp->m_dc_level_shift = 0;
		++l_tccp;
	}

	if (l_tcp->m_mct_decoding_matrix) {
		opj_free(l_tcp->m_mct_decoding_matrix);
		l_tcp->m_mct_decoding_matrix = 00;
	}

	for (i=0;i<l_nb_stages;++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);
		++p_header_data;

		if (! j2k_add_mct(l_tcp,p_j2k->m_private_image,l_tmp)) {
			return OPJ_FALSE;
		}
	}

	return OPJ_TRUE;
}